

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2s.c
# Opt level: O0

int blake2s_compress(hash_state *md,uchar *buf)

{
  long in_RSI;
  long in_RDI;
  ulong32 v [16];
  ulong32 m [16];
  unsigned_long i;
  uint local_98 [8];
  uint local_78 [8];
  int aiStack_58 [16];
  ulong local_18;
  long local_8;
  
  for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
    aiStack_58[local_18] = *(int *)(in_RSI + local_18 * 4);
    aiStack_58[local_18] = aiStack_58[local_18];
  }
  for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
    local_98[local_18] = *(uint *)(in_RDI + local_18 * 4);
  }
  local_78[0] = 0x6a09e667;
  local_78[1] = -0x4498517b;
  local_78[2] = 0x3c6ef372;
  local_78[3] = -0x5ab00ac6;
  local_78[4] = *(uint *)(in_RDI + 0x20) ^ 0x510e527f;
  local_78[5] = *(uint *)(in_RDI + 0x24) ^ 0x9b05688c;
  local_78[6] = *(uint *)(in_RDI + 0x28) ^ 0x1f83d9ab;
  local_78[7] = *(uint *)(in_RDI + 0x2c) ^ 0x5be0cd19;
  local_98[0] = local_98[0] + local_98[4] + aiStack_58[0];
  local_8 = in_RDI;
  local_78[4] = ROR(local_78[4] ^ local_98[0],0x10);
  local_78[0] = local_78[0] + local_78[4];
  local_98[4] = ROR(local_98[4] ^ local_78[0],0xc);
  local_98[0] = local_98[0] + local_98[4] + aiStack_58[1];
  local_78[4] = ROR(local_78[4] ^ local_98[0],8);
  local_78[0] = local_78[0] + local_78[4];
  local_98[4] = ROR(local_98[4] ^ local_78[0],7);
  local_98[1] = local_98[1] + local_98[5] + aiStack_58[2];
  local_78[5] = ROR(local_78[5] ^ local_98[1],0x10);
  local_78[1] = local_78[1] + local_78[5];
  local_98[5] = ROR(local_98[5] ^ local_78[1],0xc);
  local_98[1] = local_98[1] + local_98[5] + aiStack_58[3];
  local_78[5] = ROR(local_78[5] ^ local_98[1],8);
  local_78[1] = local_78[1] + local_78[5];
  local_98[5] = ROR(local_98[5] ^ local_78[1],7);
  local_98[2] = local_98[2] + local_98[6] + aiStack_58[4];
  local_78[6] = ROR(local_78[6] ^ local_98[2],0x10);
  local_78[2] = local_78[2] + local_78[6];
  local_98[6] = ROR(local_98[6] ^ local_78[2],0xc);
  local_98[2] = local_98[2] + local_98[6] + aiStack_58[5];
  local_78[6] = ROR(local_78[6] ^ local_98[2],8);
  local_78[2] = local_78[2] + local_78[6];
  local_98[6] = ROR(local_98[6] ^ local_78[2],7);
  local_98[3] = local_98[3] + local_98[7] + aiStack_58[6];
  local_78[7] = ROR(local_78[7] ^ local_98[3],0x10);
  local_78[3] = local_78[3] + local_78[7];
  local_98[7] = ROR(local_98[7] ^ local_78[3],0xc);
  local_98[3] = local_98[3] + local_98[7] + aiStack_58[7];
  local_78[7] = ROR(local_78[7] ^ local_98[3],8);
  local_78[3] = local_78[3] + local_78[7];
  local_98[7] = ROR(local_98[7] ^ local_78[3],7);
  local_98[0] = local_98[0] + local_98[5] + aiStack_58[8];
  local_78[7] = ROR(local_78[7] ^ local_98[0],0x10);
  local_78[2] = local_78[2] + local_78[7];
  local_98[5] = ROR(local_98[5] ^ local_78[2],0xc);
  local_98[0] = local_98[0] + local_98[5] + aiStack_58[9];
  local_78[7] = ROR(local_78[7] ^ local_98[0],8);
  local_78[2] = local_78[2] + local_78[7];
  local_98[5] = ROR(local_98[5] ^ local_78[2],7);
  local_98[1] = local_98[1] + local_98[6] + aiStack_58[10];
  local_78[4] = ROR(local_78[4] ^ local_98[1],0x10);
  local_78[3] = local_78[3] + local_78[4];
  local_98[6] = ROR(local_98[6] ^ local_78[3],0xc);
  local_98[1] = local_98[1] + local_98[6] + aiStack_58[0xb];
  local_78[4] = ROR(local_78[4] ^ local_98[1],8);
  local_78[3] = local_78[3] + local_78[4];
  local_98[6] = ROR(local_98[6] ^ local_78[3],7);
  local_98[2] = local_98[2] + local_98[7] + aiStack_58[0xc];
  local_78[5] = ROR(local_78[5] ^ local_98[2],0x10);
  local_78[0] = local_78[0] + local_78[5];
  local_98[7] = ROR(local_98[7] ^ local_78[0],0xc);
  local_98[2] = local_98[2] + local_98[7] + aiStack_58[0xd];
  local_78[5] = ROR(local_78[5] ^ local_98[2],8);
  local_78[0] = local_78[0] + local_78[5];
  local_98[7] = ROR(local_98[7] ^ local_78[0],7);
  local_98[3] = local_98[3] + local_98[4] + aiStack_58[0xe];
  local_78[6] = ROR(local_78[6] ^ local_98[3],0x10);
  local_78[1] = local_78[1] + local_78[6];
  local_98[4] = ROR(local_98[4] ^ local_78[1],0xc);
  local_98[3] = local_98[3] + local_98[4] + aiStack_58[0xf];
  local_78[6] = ROR(local_78[6] ^ local_98[3],8);
  local_78[1] = local_78[1] + local_78[6];
  local_98[4] = ROR(local_98[4] ^ local_78[1],7);
  local_98[0] = local_98[0] + local_98[4] + aiStack_58[0xe];
  local_78[4] = ROR(local_78[4] ^ local_98[0],0x10);
  local_78[0] = local_78[0] + local_78[4];
  local_98[4] = ROR(local_98[4] ^ local_78[0],0xc);
  local_98[0] = local_98[0] + local_98[4] + aiStack_58[10];
  local_78[4] = ROR(local_78[4] ^ local_98[0],8);
  local_78[0] = local_78[0] + local_78[4];
  local_98[4] = ROR(local_98[4] ^ local_78[0],7);
  local_98[1] = local_98[1] + local_98[5] + aiStack_58[4];
  local_78[5] = ROR(local_78[5] ^ local_98[1],0x10);
  local_78[1] = local_78[1] + local_78[5];
  local_98[5] = ROR(local_98[5] ^ local_78[1],0xc);
  local_98[1] = local_98[1] + local_98[5] + aiStack_58[8];
  local_78[5] = ROR(local_78[5] ^ local_98[1],8);
  local_78[1] = local_78[1] + local_78[5];
  local_98[5] = ROR(local_98[5] ^ local_78[1],7);
  local_98[2] = local_98[2] + local_98[6] + aiStack_58[9];
  local_78[6] = ROR(local_78[6] ^ local_98[2],0x10);
  local_78[2] = local_78[2] + local_78[6];
  local_98[6] = ROR(local_98[6] ^ local_78[2],0xc);
  local_98[2] = local_98[2] + local_98[6] + aiStack_58[0xf];
  local_78[6] = ROR(local_78[6] ^ local_98[2],8);
  local_78[2] = local_78[2] + local_78[6];
  local_98[6] = ROR(local_98[6] ^ local_78[2],7);
  local_98[3] = local_98[3] + local_98[7] + aiStack_58[0xd];
  local_78[7] = ROR(local_78[7] ^ local_98[3],0x10);
  local_78[3] = local_78[3] + local_78[7];
  local_98[7] = ROR(local_98[7] ^ local_78[3],0xc);
  local_98[3] = local_98[3] + local_98[7] + aiStack_58[6];
  local_78[7] = ROR(local_78[7] ^ local_98[3],8);
  local_78[3] = local_78[3] + local_78[7];
  local_98[7] = ROR(local_98[7] ^ local_78[3],7);
  local_98[0] = local_98[0] + local_98[5] + aiStack_58[1];
  local_78[7] = ROR(local_78[7] ^ local_98[0],0x10);
  local_78[2] = local_78[2] + local_78[7];
  local_98[5] = ROR(local_98[5] ^ local_78[2],0xc);
  local_98[0] = local_98[0] + local_98[5] + aiStack_58[0xc];
  local_78[7] = ROR(local_78[7] ^ local_98[0],8);
  local_78[2] = local_78[2] + local_78[7];
  local_98[5] = ROR(local_98[5] ^ local_78[2],7);
  local_98[1] = local_98[1] + local_98[6] + aiStack_58[0];
  local_78[4] = ROR(local_78[4] ^ local_98[1],0x10);
  local_78[3] = local_78[3] + local_78[4];
  local_98[6] = ROR(local_98[6] ^ local_78[3],0xc);
  local_98[1] = local_98[1] + local_98[6] + aiStack_58[2];
  local_78[4] = ROR(local_78[4] ^ local_98[1],8);
  local_78[3] = local_78[3] + local_78[4];
  local_98[6] = ROR(local_98[6] ^ local_78[3],7);
  local_98[2] = local_98[2] + local_98[7] + aiStack_58[0xb];
  local_78[5] = ROR(local_78[5] ^ local_98[2],0x10);
  local_78[0] = local_78[0] + local_78[5];
  local_98[7] = ROR(local_98[7] ^ local_78[0],0xc);
  local_98[2] = local_98[2] + local_98[7] + aiStack_58[7];
  local_78[5] = ROR(local_78[5] ^ local_98[2],8);
  local_78[0] = local_78[0] + local_78[5];
  local_98[7] = ROR(local_98[7] ^ local_78[0],7);
  local_98[3] = local_98[3] + local_98[4] + aiStack_58[5];
  local_78[6] = ROR(local_78[6] ^ local_98[3],0x10);
  local_78[1] = local_78[1] + local_78[6];
  local_98[4] = ROR(local_98[4] ^ local_78[1],0xc);
  local_98[3] = local_98[3] + local_98[4] + aiStack_58[3];
  local_78[6] = ROR(local_78[6] ^ local_98[3],8);
  local_78[1] = local_78[1] + local_78[6];
  local_98[4] = ROR(local_98[4] ^ local_78[1],7);
  local_98[0] = local_98[0] + local_98[4] + aiStack_58[0xb];
  local_78[4] = ROR(local_78[4] ^ local_98[0],0x10);
  local_78[0] = local_78[0] + local_78[4];
  local_98[4] = ROR(local_98[4] ^ local_78[0],0xc);
  local_98[0] = local_98[0] + local_98[4] + aiStack_58[8];
  local_78[4] = ROR(local_78[4] ^ local_98[0],8);
  local_78[0] = local_78[0] + local_78[4];
  local_98[4] = ROR(local_98[4] ^ local_78[0],7);
  local_98[1] = local_98[1] + local_98[5] + aiStack_58[0xc];
  local_78[5] = ROR(local_78[5] ^ local_98[1],0x10);
  local_78[1] = local_78[1] + local_78[5];
  local_98[5] = ROR(local_98[5] ^ local_78[1],0xc);
  local_98[1] = local_98[1] + local_98[5] + aiStack_58[0];
  local_78[5] = ROR(local_78[5] ^ local_98[1],8);
  local_78[1] = local_78[1] + local_78[5];
  local_98[5] = ROR(local_98[5] ^ local_78[1],7);
  local_98[2] = local_98[2] + local_98[6] + aiStack_58[5];
  local_78[6] = ROR(local_78[6] ^ local_98[2],0x10);
  local_78[2] = local_78[2] + local_78[6];
  local_98[6] = ROR(local_98[6] ^ local_78[2],0xc);
  local_98[2] = local_98[2] + local_98[6] + aiStack_58[2];
  local_78[6] = ROR(local_78[6] ^ local_98[2],8);
  local_78[2] = local_78[2] + local_78[6];
  local_98[6] = ROR(local_98[6] ^ local_78[2],7);
  local_98[3] = local_98[3] + local_98[7] + aiStack_58[0xf];
  local_78[7] = ROR(local_78[7] ^ local_98[3],0x10);
  local_78[3] = local_78[3] + local_78[7];
  local_98[7] = ROR(local_98[7] ^ local_78[3],0xc);
  local_98[3] = local_98[3] + local_98[7] + aiStack_58[0xd];
  local_78[7] = ROR(local_78[7] ^ local_98[3],8);
  local_78[3] = local_78[3] + local_78[7];
  local_98[7] = ROR(local_98[7] ^ local_78[3],7);
  local_98[0] = local_98[0] + local_98[5] + aiStack_58[10];
  local_78[7] = ROR(local_78[7] ^ local_98[0],0x10);
  local_78[2] = local_78[2] + local_78[7];
  local_98[5] = ROR(local_98[5] ^ local_78[2],0xc);
  local_98[0] = local_98[0] + local_98[5] + aiStack_58[0xe];
  local_78[7] = ROR(local_78[7] ^ local_98[0],8);
  local_78[2] = local_78[2] + local_78[7];
  local_98[5] = ROR(local_98[5] ^ local_78[2],7);
  local_98[1] = local_98[1] + local_98[6] + aiStack_58[3];
  local_78[4] = ROR(local_78[4] ^ local_98[1],0x10);
  local_78[3] = local_78[3] + local_78[4];
  local_98[6] = ROR(local_98[6] ^ local_78[3],0xc);
  local_98[1] = local_98[1] + local_98[6] + aiStack_58[6];
  local_78[4] = ROR(local_78[4] ^ local_98[1],8);
  local_78[3] = local_78[3] + local_78[4];
  local_98[6] = ROR(local_98[6] ^ local_78[3],7);
  local_98[2] = local_98[2] + local_98[7] + aiStack_58[7];
  local_78[5] = ROR(local_78[5] ^ local_98[2],0x10);
  local_78[0] = local_78[0] + local_78[5];
  local_98[7] = ROR(local_98[7] ^ local_78[0],0xc);
  local_98[2] = local_98[2] + local_98[7] + aiStack_58[1];
  local_78[5] = ROR(local_78[5] ^ local_98[2],8);
  local_78[0] = local_78[0] + local_78[5];
  local_98[7] = ROR(local_98[7] ^ local_78[0],7);
  local_98[3] = local_98[3] + local_98[4] + aiStack_58[9];
  local_78[6] = ROR(local_78[6] ^ local_98[3],0x10);
  local_78[1] = local_78[1] + local_78[6];
  local_98[4] = ROR(local_98[4] ^ local_78[1],0xc);
  local_98[3] = local_98[3] + local_98[4] + aiStack_58[4];
  local_78[6] = ROR(local_78[6] ^ local_98[3],8);
  local_78[1] = local_78[1] + local_78[6];
  local_98[4] = ROR(local_98[4] ^ local_78[1],7);
  local_98[0] = local_98[0] + local_98[4] + aiStack_58[7];
  local_78[4] = ROR(local_78[4] ^ local_98[0],0x10);
  local_78[0] = local_78[0] + local_78[4];
  local_98[4] = ROR(local_98[4] ^ local_78[0],0xc);
  local_98[0] = local_98[0] + local_98[4] + aiStack_58[9];
  local_78[4] = ROR(local_78[4] ^ local_98[0],8);
  local_78[0] = local_78[0] + local_78[4];
  local_98[4] = ROR(local_98[4] ^ local_78[0],7);
  local_98[1] = local_98[1] + local_98[5] + aiStack_58[3];
  local_78[5] = ROR(local_78[5] ^ local_98[1],0x10);
  local_78[1] = local_78[1] + local_78[5];
  local_98[5] = ROR(local_98[5] ^ local_78[1],0xc);
  local_98[1] = local_98[1] + local_98[5] + aiStack_58[1];
  local_78[5] = ROR(local_78[5] ^ local_98[1],8);
  local_78[1] = local_78[1] + local_78[5];
  local_98[5] = ROR(local_98[5] ^ local_78[1],7);
  local_98[2] = local_98[2] + local_98[6] + aiStack_58[0xd];
  local_78[6] = ROR(local_78[6] ^ local_98[2],0x10);
  local_78[2] = local_78[2] + local_78[6];
  local_98[6] = ROR(local_98[6] ^ local_78[2],0xc);
  local_98[2] = local_98[2] + local_98[6] + aiStack_58[0xc];
  local_78[6] = ROR(local_78[6] ^ local_98[2],8);
  local_78[2] = local_78[2] + local_78[6];
  local_98[6] = ROR(local_98[6] ^ local_78[2],7);
  local_98[3] = local_98[3] + local_98[7] + aiStack_58[0xb];
  local_78[7] = ROR(local_78[7] ^ local_98[3],0x10);
  local_78[3] = local_78[3] + local_78[7];
  local_98[7] = ROR(local_98[7] ^ local_78[3],0xc);
  local_98[3] = local_98[3] + local_98[7] + aiStack_58[0xe];
  local_78[7] = ROR(local_78[7] ^ local_98[3],8);
  local_78[3] = local_78[3] + local_78[7];
  local_98[7] = ROR(local_98[7] ^ local_78[3],7);
  local_98[0] = local_98[0] + local_98[5] + aiStack_58[2];
  local_78[7] = ROR(local_78[7] ^ local_98[0],0x10);
  local_78[2] = local_78[2] + local_78[7];
  local_98[5] = ROR(local_98[5] ^ local_78[2],0xc);
  local_98[0] = local_98[0] + local_98[5] + aiStack_58[6];
  local_78[7] = ROR(local_78[7] ^ local_98[0],8);
  local_78[2] = local_78[2] + local_78[7];
  local_98[5] = ROR(local_98[5] ^ local_78[2],7);
  local_98[1] = local_98[1] + local_98[6] + aiStack_58[5];
  local_78[4] = ROR(local_78[4] ^ local_98[1],0x10);
  local_78[3] = local_78[3] + local_78[4];
  local_98[6] = ROR(local_98[6] ^ local_78[3],0xc);
  local_98[1] = local_98[1] + local_98[6] + aiStack_58[10];
  local_78[4] = ROR(local_78[4] ^ local_98[1],8);
  local_78[3] = local_78[3] + local_78[4];
  local_98[6] = ROR(local_98[6] ^ local_78[3],7);
  local_98[2] = local_98[2] + local_98[7] + aiStack_58[4];
  local_78[5] = ROR(local_78[5] ^ local_98[2],0x10);
  local_78[0] = local_78[0] + local_78[5];
  local_98[7] = ROR(local_98[7] ^ local_78[0],0xc);
  local_98[2] = local_98[2] + local_98[7] + aiStack_58[0];
  local_78[5] = ROR(local_78[5] ^ local_98[2],8);
  local_78[0] = local_78[0] + local_78[5];
  local_98[7] = ROR(local_98[7] ^ local_78[0],7);
  local_98[3] = local_98[3] + local_98[4] + aiStack_58[0xf];
  local_78[6] = ROR(local_78[6] ^ local_98[3],0x10);
  local_78[1] = local_78[1] + local_78[6];
  local_98[4] = ROR(local_98[4] ^ local_78[1],0xc);
  local_98[3] = local_98[3] + local_98[4] + aiStack_58[8];
  local_78[6] = ROR(local_78[6] ^ local_98[3],8);
  local_78[1] = local_78[1] + local_78[6];
  local_98[4] = ROR(local_98[4] ^ local_78[1],7);
  local_98[0] = local_98[0] + local_98[4] + aiStack_58[9];
  local_78[4] = ROR(local_78[4] ^ local_98[0],0x10);
  local_78[0] = local_78[0] + local_78[4];
  local_98[4] = ROR(local_98[4] ^ local_78[0],0xc);
  local_98[0] = local_98[0] + local_98[4] + aiStack_58[0];
  local_78[4] = ROR(local_78[4] ^ local_98[0],8);
  local_78[0] = local_78[0] + local_78[4];
  local_98[4] = ROR(local_98[4] ^ local_78[0],7);
  local_98[1] = local_98[1] + local_98[5] + aiStack_58[5];
  local_78[5] = ROR(local_78[5] ^ local_98[1],0x10);
  local_78[1] = local_78[1] + local_78[5];
  local_98[5] = ROR(local_98[5] ^ local_78[1],0xc);
  local_98[1] = local_98[1] + local_98[5] + aiStack_58[7];
  local_78[5] = ROR(local_78[5] ^ local_98[1],8);
  local_78[1] = local_78[1] + local_78[5];
  local_98[5] = ROR(local_98[5] ^ local_78[1],7);
  local_98[2] = local_98[2] + local_98[6] + aiStack_58[2];
  local_78[6] = ROR(local_78[6] ^ local_98[2],0x10);
  local_78[2] = local_78[2] + local_78[6];
  local_98[6] = ROR(local_98[6] ^ local_78[2],0xc);
  local_98[2] = local_98[2] + local_98[6] + aiStack_58[4];
  local_78[6] = ROR(local_78[6] ^ local_98[2],8);
  local_78[2] = local_78[2] + local_78[6];
  local_98[6] = ROR(local_98[6] ^ local_78[2],7);
  local_98[3] = local_98[3] + local_98[7] + aiStack_58[10];
  local_78[7] = ROR(local_78[7] ^ local_98[3],0x10);
  local_78[3] = local_78[3] + local_78[7];
  local_98[7] = ROR(local_98[7] ^ local_78[3],0xc);
  local_98[3] = local_98[3] + local_98[7] + aiStack_58[0xf];
  local_78[7] = ROR(local_78[7] ^ local_98[3],8);
  local_78[3] = local_78[3] + local_78[7];
  local_98[7] = ROR(local_98[7] ^ local_78[3],7);
  local_98[0] = local_98[0] + local_98[5] + aiStack_58[0xe];
  local_78[7] = ROR(local_78[7] ^ local_98[0],0x10);
  local_78[2] = local_78[2] + local_78[7];
  local_98[5] = ROR(local_98[5] ^ local_78[2],0xc);
  local_98[0] = local_98[0] + local_98[5] + aiStack_58[1];
  local_78[7] = ROR(local_78[7] ^ local_98[0],8);
  local_78[2] = local_78[2] + local_78[7];
  local_98[5] = ROR(local_98[5] ^ local_78[2],7);
  local_98[1] = local_98[1] + local_98[6] + aiStack_58[0xb];
  local_78[4] = ROR(local_78[4] ^ local_98[1],0x10);
  local_78[3] = local_78[3] + local_78[4];
  local_98[6] = ROR(local_98[6] ^ local_78[3],0xc);
  local_98[1] = local_98[1] + local_98[6] + aiStack_58[0xc];
  local_78[4] = ROR(local_78[4] ^ local_98[1],8);
  local_78[3] = local_78[3] + local_78[4];
  local_98[6] = ROR(local_98[6] ^ local_78[3],7);
  local_98[2] = local_98[2] + local_98[7] + aiStack_58[6];
  local_78[5] = ROR(local_78[5] ^ local_98[2],0x10);
  local_78[0] = local_78[0] + local_78[5];
  local_98[7] = ROR(local_98[7] ^ local_78[0],0xc);
  local_98[2] = local_98[2] + local_98[7] + aiStack_58[8];
  local_78[5] = ROR(local_78[5] ^ local_98[2],8);
  local_78[0] = local_78[0] + local_78[5];
  local_98[7] = ROR(local_98[7] ^ local_78[0],7);
  local_98[3] = local_98[3] + local_98[4] + aiStack_58[3];
  local_78[6] = ROR(local_78[6] ^ local_98[3],0x10);
  local_78[1] = local_78[1] + local_78[6];
  local_98[4] = ROR(local_98[4] ^ local_78[1],0xc);
  local_98[3] = local_98[3] + local_98[4] + aiStack_58[0xd];
  local_78[6] = ROR(local_78[6] ^ local_98[3],8);
  local_78[1] = local_78[1] + local_78[6];
  local_98[4] = ROR(local_98[4] ^ local_78[1],7);
  local_98[0] = local_98[0] + local_98[4] + aiStack_58[2];
  local_78[4] = ROR(local_78[4] ^ local_98[0],0x10);
  local_78[0] = local_78[0] + local_78[4];
  local_98[4] = ROR(local_98[4] ^ local_78[0],0xc);
  local_98[0] = local_98[0] + local_98[4] + aiStack_58[0xc];
  local_78[4] = ROR(local_78[4] ^ local_98[0],8);
  local_78[0] = local_78[0] + local_78[4];
  local_98[4] = ROR(local_98[4] ^ local_78[0],7);
  local_98[1] = local_98[1] + local_98[5] + aiStack_58[6];
  local_78[5] = ROR(local_78[5] ^ local_98[1],0x10);
  local_78[1] = local_78[1] + local_78[5];
  local_98[5] = ROR(local_98[5] ^ local_78[1],0xc);
  local_98[1] = local_98[1] + local_98[5] + aiStack_58[10];
  local_78[5] = ROR(local_78[5] ^ local_98[1],8);
  local_78[1] = local_78[1] + local_78[5];
  local_98[5] = ROR(local_98[5] ^ local_78[1],7);
  local_98[2] = local_98[2] + local_98[6] + aiStack_58[0];
  local_78[6] = ROR(local_78[6] ^ local_98[2],0x10);
  local_78[2] = local_78[2] + local_78[6];
  local_98[6] = ROR(local_98[6] ^ local_78[2],0xc);
  local_98[2] = local_98[2] + local_98[6] + aiStack_58[0xb];
  local_78[6] = ROR(local_78[6] ^ local_98[2],8);
  local_78[2] = local_78[2] + local_78[6];
  local_98[6] = ROR(local_98[6] ^ local_78[2],7);
  local_98[3] = local_98[3] + local_98[7] + aiStack_58[8];
  local_78[7] = ROR(local_78[7] ^ local_98[3],0x10);
  local_78[3] = local_78[3] + local_78[7];
  local_98[7] = ROR(local_98[7] ^ local_78[3],0xc);
  local_98[3] = local_98[3] + local_98[7] + aiStack_58[3];
  local_78[7] = ROR(local_78[7] ^ local_98[3],8);
  local_78[3] = local_78[3] + local_78[7];
  local_98[7] = ROR(local_98[7] ^ local_78[3],7);
  local_98[0] = local_98[0] + local_98[5] + aiStack_58[4];
  local_78[7] = ROR(local_78[7] ^ local_98[0],0x10);
  local_78[2] = local_78[2] + local_78[7];
  local_98[5] = ROR(local_98[5] ^ local_78[2],0xc);
  local_98[0] = local_98[0] + local_98[5] + aiStack_58[0xd];
  local_78[7] = ROR(local_78[7] ^ local_98[0],8);
  local_78[2] = local_78[2] + local_78[7];
  local_98[5] = ROR(local_98[5] ^ local_78[2],7);
  local_98[1] = local_98[1] + local_98[6] + aiStack_58[7];
  local_78[4] = ROR(local_78[4] ^ local_98[1],0x10);
  local_78[3] = local_78[3] + local_78[4];
  local_98[6] = ROR(local_98[6] ^ local_78[3],0xc);
  local_98[1] = local_98[1] + local_98[6] + aiStack_58[5];
  local_78[4] = ROR(local_78[4] ^ local_98[1],8);
  local_78[3] = local_78[3] + local_78[4];
  local_98[6] = ROR(local_98[6] ^ local_78[3],7);
  local_98[2] = local_98[2] + local_98[7] + aiStack_58[0xf];
  local_78[5] = ROR(local_78[5] ^ local_98[2],0x10);
  local_78[0] = local_78[0] + local_78[5];
  local_98[7] = ROR(local_98[7] ^ local_78[0],0xc);
  local_98[2] = local_98[2] + local_98[7] + aiStack_58[0xe];
  local_78[5] = ROR(local_78[5] ^ local_98[2],8);
  local_78[0] = local_78[0] + local_78[5];
  local_98[7] = ROR(local_98[7] ^ local_78[0],7);
  local_98[3] = local_98[3] + local_98[4] + aiStack_58[1];
  local_78[6] = ROR(local_78[6] ^ local_98[3],0x10);
  local_78[1] = local_78[1] + local_78[6];
  local_98[4] = ROR(local_98[4] ^ local_78[1],0xc);
  local_98[3] = local_98[3] + local_98[4] + aiStack_58[9];
  local_78[6] = ROR(local_78[6] ^ local_98[3],8);
  local_78[1] = local_78[1] + local_78[6];
  local_98[4] = ROR(local_98[4] ^ local_78[1],7);
  local_98[0] = local_98[0] + local_98[4] + aiStack_58[0xc];
  local_78[4] = ROR(local_78[4] ^ local_98[0],0x10);
  local_78[0] = local_78[0] + local_78[4];
  local_98[4] = ROR(local_98[4] ^ local_78[0],0xc);
  local_98[0] = local_98[0] + local_98[4] + aiStack_58[5];
  local_78[4] = ROR(local_78[4] ^ local_98[0],8);
  local_78[0] = local_78[0] + local_78[4];
  local_98[4] = ROR(local_98[4] ^ local_78[0],7);
  local_98[1] = local_98[1] + local_98[5] + aiStack_58[1];
  local_78[5] = ROR(local_78[5] ^ local_98[1],0x10);
  local_78[1] = local_78[1] + local_78[5];
  local_98[5] = ROR(local_98[5] ^ local_78[1],0xc);
  local_98[1] = local_98[1] + local_98[5] + aiStack_58[0xf];
  local_78[5] = ROR(local_78[5] ^ local_98[1],8);
  local_78[1] = local_78[1] + local_78[5];
  local_98[5] = ROR(local_98[5] ^ local_78[1],7);
  local_98[2] = local_98[2] + local_98[6] + aiStack_58[0xe];
  local_78[6] = ROR(local_78[6] ^ local_98[2],0x10);
  local_78[2] = local_78[2] + local_78[6];
  local_98[6] = ROR(local_98[6] ^ local_78[2],0xc);
  local_98[2] = local_98[2] + local_98[6] + aiStack_58[0xd];
  local_78[6] = ROR(local_78[6] ^ local_98[2],8);
  local_78[2] = local_78[2] + local_78[6];
  local_98[6] = ROR(local_98[6] ^ local_78[2],7);
  local_98[3] = local_98[3] + local_98[7] + aiStack_58[4];
  local_78[7] = ROR(local_78[7] ^ local_98[3],0x10);
  local_78[3] = local_78[3] + local_78[7];
  local_98[7] = ROR(local_98[7] ^ local_78[3],0xc);
  local_98[3] = local_98[3] + local_98[7] + aiStack_58[10];
  local_78[7] = ROR(local_78[7] ^ local_98[3],8);
  local_78[3] = local_78[3] + local_78[7];
  local_98[7] = ROR(local_98[7] ^ local_78[3],7);
  local_98[0] = local_98[0] + local_98[5] + aiStack_58[0];
  local_78[7] = ROR(local_78[7] ^ local_98[0],0x10);
  local_78[2] = local_78[2] + local_78[7];
  local_98[5] = ROR(local_98[5] ^ local_78[2],0xc);
  local_98[0] = local_98[0] + local_98[5] + aiStack_58[7];
  local_78[7] = ROR(local_78[7] ^ local_98[0],8);
  local_78[2] = local_78[2] + local_78[7];
  local_98[5] = ROR(local_98[5] ^ local_78[2],7);
  local_98[1] = local_98[1] + local_98[6] + aiStack_58[6];
  local_78[4] = ROR(local_78[4] ^ local_98[1],0x10);
  local_78[3] = local_78[3] + local_78[4];
  local_98[6] = ROR(local_98[6] ^ local_78[3],0xc);
  local_98[1] = local_98[1] + local_98[6] + aiStack_58[3];
  local_78[4] = ROR(local_78[4] ^ local_98[1],8);
  local_78[3] = local_78[3] + local_78[4];
  local_98[6] = ROR(local_98[6] ^ local_78[3],7);
  local_98[2] = local_98[2] + local_98[7] + aiStack_58[9];
  local_78[5] = ROR(local_78[5] ^ local_98[2],0x10);
  local_78[0] = local_78[0] + local_78[5];
  local_98[7] = ROR(local_98[7] ^ local_78[0],0xc);
  local_98[2] = local_98[2] + local_98[7] + aiStack_58[2];
  local_78[5] = ROR(local_78[5] ^ local_98[2],8);
  local_78[0] = local_78[0] + local_78[5];
  local_98[7] = ROR(local_98[7] ^ local_78[0],7);
  local_98[3] = local_98[3] + local_98[4] + aiStack_58[8];
  local_78[6] = ROR(local_78[6] ^ local_98[3],0x10);
  local_78[1] = local_78[1] + local_78[6];
  local_98[4] = ROR(local_98[4] ^ local_78[1],0xc);
  local_98[3] = local_98[3] + local_98[4] + aiStack_58[0xb];
  local_78[6] = ROR(local_78[6] ^ local_98[3],8);
  local_78[1] = local_78[1] + local_78[6];
  local_98[4] = ROR(local_98[4] ^ local_78[1],7);
  local_98[0] = local_98[0] + local_98[4] + aiStack_58[0xd];
  local_78[4] = ROR(local_78[4] ^ local_98[0],0x10);
  local_78[0] = local_78[0] + local_78[4];
  local_98[4] = ROR(local_98[4] ^ local_78[0],0xc);
  local_98[0] = local_98[0] + local_98[4] + aiStack_58[0xb];
  local_78[4] = ROR(local_78[4] ^ local_98[0],8);
  local_78[0] = local_78[0] + local_78[4];
  local_98[4] = ROR(local_98[4] ^ local_78[0],7);
  local_98[1] = local_98[1] + local_98[5] + aiStack_58[7];
  local_78[5] = ROR(local_78[5] ^ local_98[1],0x10);
  local_78[1] = local_78[1] + local_78[5];
  local_98[5] = ROR(local_98[5] ^ local_78[1],0xc);
  local_98[1] = local_98[1] + local_98[5] + aiStack_58[0xe];
  local_78[5] = ROR(local_78[5] ^ local_98[1],8);
  local_78[1] = local_78[1] + local_78[5];
  local_98[5] = ROR(local_98[5] ^ local_78[1],7);
  local_98[2] = local_98[2] + local_98[6] + aiStack_58[0xc];
  local_78[6] = ROR(local_78[6] ^ local_98[2],0x10);
  local_78[2] = local_78[2] + local_78[6];
  local_98[6] = ROR(local_98[6] ^ local_78[2],0xc);
  local_98[2] = local_98[2] + local_98[6] + aiStack_58[1];
  local_78[6] = ROR(local_78[6] ^ local_98[2],8);
  local_78[2] = local_78[2] + local_78[6];
  local_98[6] = ROR(local_98[6] ^ local_78[2],7);
  local_98[3] = local_98[3] + local_98[7] + aiStack_58[3];
  local_78[7] = ROR(local_78[7] ^ local_98[3],0x10);
  local_78[3] = local_78[3] + local_78[7];
  local_98[7] = ROR(local_98[7] ^ local_78[3],0xc);
  local_98[3] = local_98[3] + local_98[7] + aiStack_58[9];
  local_78[7] = ROR(local_78[7] ^ local_98[3],8);
  local_78[3] = local_78[3] + local_78[7];
  local_98[7] = ROR(local_98[7] ^ local_78[3],7);
  local_98[0] = local_98[0] + local_98[5] + aiStack_58[5];
  local_78[7] = ROR(local_78[7] ^ local_98[0],0x10);
  local_78[2] = local_78[2] + local_78[7];
  local_98[5] = ROR(local_98[5] ^ local_78[2],0xc);
  local_98[0] = local_98[0] + local_98[5] + aiStack_58[0];
  local_78[7] = ROR(local_78[7] ^ local_98[0],8);
  local_78[2] = local_78[2] + local_78[7];
  local_98[5] = ROR(local_98[5] ^ local_78[2],7);
  local_98[1] = local_98[1] + local_98[6] + aiStack_58[0xf];
  local_78[4] = ROR(local_78[4] ^ local_98[1],0x10);
  local_78[3] = local_78[3] + local_78[4];
  local_98[6] = ROR(local_98[6] ^ local_78[3],0xc);
  local_98[1] = local_98[1] + local_98[6] + aiStack_58[4];
  local_78[4] = ROR(local_78[4] ^ local_98[1],8);
  local_78[3] = local_78[3] + local_78[4];
  local_98[6] = ROR(local_98[6] ^ local_78[3],7);
  local_98[2] = local_98[2] + local_98[7] + aiStack_58[8];
  local_78[5] = ROR(local_78[5] ^ local_98[2],0x10);
  local_78[0] = local_78[0] + local_78[5];
  local_98[7] = ROR(local_98[7] ^ local_78[0],0xc);
  local_98[2] = local_98[2] + local_98[7] + aiStack_58[6];
  local_78[5] = ROR(local_78[5] ^ local_98[2],8);
  local_78[0] = local_78[0] + local_78[5];
  local_98[7] = ROR(local_98[7] ^ local_78[0],7);
  local_98[3] = local_98[3] + local_98[4] + aiStack_58[2];
  local_78[6] = ROR(local_78[6] ^ local_98[3],0x10);
  local_78[1] = local_78[1] + local_78[6];
  local_98[4] = ROR(local_98[4] ^ local_78[1],0xc);
  local_98[3] = local_98[3] + local_98[4] + aiStack_58[10];
  local_78[6] = ROR(local_78[6] ^ local_98[3],8);
  local_78[1] = local_78[1] + local_78[6];
  local_98[4] = ROR(local_98[4] ^ local_78[1],7);
  local_98[0] = local_98[0] + local_98[4] + aiStack_58[6];
  local_78[4] = ROR(local_78[4] ^ local_98[0],0x10);
  local_78[0] = local_78[0] + local_78[4];
  local_98[4] = ROR(local_98[4] ^ local_78[0],0xc);
  local_98[0] = local_98[0] + local_98[4] + aiStack_58[0xf];
  local_78[4] = ROR(local_78[4] ^ local_98[0],8);
  local_78[0] = local_78[0] + local_78[4];
  local_98[4] = ROR(local_98[4] ^ local_78[0],7);
  local_98[1] = local_98[1] + local_98[5] + aiStack_58[0xe];
  local_78[5] = ROR(local_78[5] ^ local_98[1],0x10);
  local_78[1] = local_78[1] + local_78[5];
  local_98[5] = ROR(local_98[5] ^ local_78[1],0xc);
  local_98[1] = local_98[1] + local_98[5] + aiStack_58[9];
  local_78[5] = ROR(local_78[5] ^ local_98[1],8);
  local_78[1] = local_78[1] + local_78[5];
  local_98[5] = ROR(local_98[5] ^ local_78[1],7);
  local_98[2] = local_98[2] + local_98[6] + aiStack_58[0xb];
  local_78[6] = ROR(local_78[6] ^ local_98[2],0x10);
  local_78[2] = local_78[2] + local_78[6];
  local_98[6] = ROR(local_98[6] ^ local_78[2],0xc);
  local_98[2] = local_98[2] + local_98[6] + aiStack_58[3];
  local_78[6] = ROR(local_78[6] ^ local_98[2],8);
  local_78[2] = local_78[2] + local_78[6];
  local_98[6] = ROR(local_98[6] ^ local_78[2],7);
  local_98[3] = local_98[3] + local_98[7] + aiStack_58[0];
  local_78[7] = ROR(local_78[7] ^ local_98[3],0x10);
  local_78[3] = local_78[3] + local_78[7];
  local_98[7] = ROR(local_98[7] ^ local_78[3],0xc);
  local_98[3] = local_98[3] + local_98[7] + aiStack_58[8];
  local_78[7] = ROR(local_78[7] ^ local_98[3],8);
  local_78[3] = local_78[3] + local_78[7];
  local_98[7] = ROR(local_98[7] ^ local_78[3],7);
  local_98[0] = local_98[0] + local_98[5] + aiStack_58[0xc];
  local_78[7] = ROR(local_78[7] ^ local_98[0],0x10);
  local_78[2] = local_78[2] + local_78[7];
  local_98[5] = ROR(local_98[5] ^ local_78[2],0xc);
  local_98[0] = local_98[0] + local_98[5] + aiStack_58[2];
  local_78[7] = ROR(local_78[7] ^ local_98[0],8);
  local_78[2] = local_78[2] + local_78[7];
  local_98[5] = ROR(local_98[5] ^ local_78[2],7);
  local_98[1] = local_98[1] + local_98[6] + aiStack_58[0xd];
  local_78[4] = ROR(local_78[4] ^ local_98[1],0x10);
  local_78[3] = local_78[3] + local_78[4];
  local_98[6] = ROR(local_98[6] ^ local_78[3],0xc);
  local_98[1] = local_98[1] + local_98[6] + aiStack_58[7];
  local_78[4] = ROR(local_78[4] ^ local_98[1],8);
  local_78[3] = local_78[3] + local_78[4];
  local_98[6] = ROR(local_98[6] ^ local_78[3],7);
  local_98[2] = local_98[2] + local_98[7] + aiStack_58[1];
  local_78[5] = ROR(local_78[5] ^ local_98[2],0x10);
  local_78[0] = local_78[0] + local_78[5];
  local_98[7] = ROR(local_98[7] ^ local_78[0],0xc);
  local_98[2] = local_98[2] + local_98[7] + aiStack_58[4];
  local_78[5] = ROR(local_78[5] ^ local_98[2],8);
  local_78[0] = local_78[0] + local_78[5];
  local_98[7] = ROR(local_98[7] ^ local_78[0],7);
  local_98[3] = local_98[3] + local_98[4] + aiStack_58[10];
  local_78[6] = ROR(local_78[6] ^ local_98[3],0x10);
  local_78[1] = local_78[1] + local_78[6];
  local_98[4] = ROR(local_98[4] ^ local_78[1],0xc);
  local_98[3] = local_98[3] + local_98[4] + aiStack_58[5];
  local_78[6] = ROR(local_78[6] ^ local_98[3],8);
  local_78[1] = local_78[1] + local_78[6];
  local_98[4] = ROR(local_98[4] ^ local_78[1],7);
  local_98[0] = local_98[0] + local_98[4] + aiStack_58[10];
  local_78[4] = ROR(local_78[4] ^ local_98[0],0x10);
  local_78[0] = local_78[0] + local_78[4];
  local_98[4] = ROR(local_98[4] ^ local_78[0],0xc);
  local_98[0] = local_98[0] + local_98[4] + aiStack_58[2];
  local_78[4] = ROR(local_78[4] ^ local_98[0],8);
  local_78[0] = local_78[0] + local_78[4];
  local_98[4] = ROR(local_98[4] ^ local_78[0],7);
  local_98[1] = local_98[1] + local_98[5] + aiStack_58[8];
  local_78[5] = ROR(local_78[5] ^ local_98[1],0x10);
  local_78[1] = local_78[1] + local_78[5];
  local_98[5] = ROR(local_98[5] ^ local_78[1],0xc);
  local_98[1] = local_98[1] + local_98[5] + aiStack_58[4];
  local_78[5] = ROR(local_78[5] ^ local_98[1],8);
  local_78[1] = local_78[1] + local_78[5];
  local_98[5] = ROR(local_98[5] ^ local_78[1],7);
  local_98[2] = local_98[2] + local_98[6] + aiStack_58[7];
  local_78[6] = ROR(local_78[6] ^ local_98[2],0x10);
  local_78[2] = local_78[2] + local_78[6];
  local_98[6] = ROR(local_98[6] ^ local_78[2],0xc);
  local_98[2] = local_98[2] + local_98[6] + aiStack_58[6];
  local_78[6] = ROR(local_78[6] ^ local_98[2],8);
  local_78[2] = local_78[2] + local_78[6];
  local_98[6] = ROR(local_98[6] ^ local_78[2],7);
  local_98[3] = local_98[3] + local_98[7] + aiStack_58[1];
  local_78[7] = ROR(local_78[7] ^ local_98[3],0x10);
  local_78[3] = local_78[3] + local_78[7];
  local_98[7] = ROR(local_98[7] ^ local_78[3],0xc);
  local_98[3] = local_98[3] + local_98[7] + aiStack_58[5];
  local_78[7] = ROR(local_78[7] ^ local_98[3],8);
  local_78[3] = local_78[3] + local_78[7];
  local_98[7] = ROR(local_98[7] ^ local_78[3],7);
  local_98[0] = local_98[0] + local_98[5] + aiStack_58[0xf];
  local_78[7] = ROR(local_78[7] ^ local_98[0],0x10);
  local_78[2] = local_78[2] + local_78[7];
  local_98[5] = ROR(local_98[5] ^ local_78[2],0xc);
  local_98[0] = local_98[0] + local_98[5] + aiStack_58[0xb];
  local_78[7] = ROR(local_78[7] ^ local_98[0],8);
  local_78[2] = local_78[2] + local_78[7];
  local_98[5] = ROR(local_98[5] ^ local_78[2],7);
  local_98[1] = local_98[1] + local_98[6] + aiStack_58[9];
  local_78[4] = ROR(local_78[4] ^ local_98[1],0x10);
  local_78[3] = local_78[3] + local_78[4];
  local_98[6] = ROR(local_98[6] ^ local_78[3],0xc);
  local_98[1] = local_98[1] + local_98[6] + aiStack_58[0xe];
  local_78[4] = ROR(local_78[4] ^ local_98[1],8);
  local_78[3] = local_78[3] + local_78[4];
  local_98[6] = ROR(local_98[6] ^ local_78[3],7);
  local_98[2] = local_98[2] + local_98[7] + aiStack_58[3];
  local_78[5] = ROR(local_78[5] ^ local_98[2],0x10);
  local_78[0] = local_78[0] + local_78[5];
  local_98[7] = ROR(local_98[7] ^ local_78[0],0xc);
  local_98[2] = local_98[2] + local_98[7] + aiStack_58[0xc];
  local_78[5] = ROR(local_78[5] ^ local_98[2],8);
  local_78[0] = local_78[0] + local_78[5];
  local_98[7] = ROR(local_98[7] ^ local_78[0],7);
  local_98[3] = local_98[3] + local_98[4] + aiStack_58[0xd];
  local_78[6] = ROR(local_78[6] ^ local_98[3],0x10);
  local_78[1] = local_78[1] + local_78[6];
  local_98[4] = ROR(local_98[4] ^ local_78[1],0xc);
  local_98[3] = local_98[3] + local_98[4] + aiStack_58[0];
  local_78[6] = ROR(local_78[6] ^ local_98[3],8);
  local_78[1] = local_78[1] + local_78[6];
  local_98[4] = ROR(local_98[4] ^ local_78[1],7);
  for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
    *(uint *)(local_8 + local_18 * 4) =
         *(uint *)(local_8 + local_18 * 4) ^ local_98[local_18] ^ local_78[local_18];
  }
  return 0;
}

Assistant:

static int blake2s_compress(hash_state *md, const unsigned char *buf)
#endif
{
   unsigned long i;
   ulong32 m[16];
   ulong32 v[16];

   for (i = 0; i < 16; ++i) {
      LOAD32L(m[i], buf + i * sizeof(m[i]));
   }

   for (i = 0; i < 8; ++i)
      v[i] = md->blake2s.h[i];

   v[8] = blake2s_IV[0];
   v[9] = blake2s_IV[1];
   v[10] = blake2s_IV[2];
   v[11] = blake2s_IV[3];
   v[12] = md->blake2s.t[0] ^ blake2s_IV[4];
   v[13] = md->blake2s.t[1] ^ blake2s_IV[5];
   v[14] = md->blake2s.f[0] ^ blake2s_IV[6];
   v[15] = md->blake2s.f[1] ^ blake2s_IV[7];

   ROUND(0);
   ROUND(1);
   ROUND(2);
   ROUND(3);
   ROUND(4);
   ROUND(5);
   ROUND(6);
   ROUND(7);
   ROUND(8);
   ROUND(9);

   for (i = 0; i < 8; ++i)
      md->blake2s.h[i] = md->blake2s.h[i] ^ v[i] ^ v[i + 8];

   return CRYPT_OK;
}